

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_6340f::OpenXrProgram::InitializeSession(OpenXrProgram *this)

{
  XrSession *ppXVar1;
  array<unsigned_long,_2UL> *paVar2;
  XrAction *ppXVar3;
  XrAction *ppXVar4;
  XrAction *ppXVar5;
  pointer *pppXVar6;
  pointer pcVar7;
  iterator __position;
  XrActionSuggestedBinding *pXVar8;
  vector<XrSpace_T*,std::allocator<XrSpace_T*>> *pvVar9;
  int iVar10;
  XrResult XVar11;
  uint uVar12;
  undefined4 extraout_var;
  char *pcVar13;
  long lVar14;
  char *originator;
  long *plVar15;
  XrActionSuggestedBinding *pXVar16;
  initializer_list<XrActionSuggestedBinding> __l;
  initializer_list<XrActionSuggestedBinding> __l_00;
  initializer_list<XrActionSuggestedBinding> __l_01;
  initializer_list<XrActionSuggestedBinding> __l_02;
  initializer_list<XrActionSuggestedBinding> __l_03;
  XrPath khrSimpleInteractionProfilePath;
  vector<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_> spaces;
  array<unsigned_long,_2UL> hapticPath;
  array<unsigned_long,_2UL> posePath;
  array<unsigned_long,_2UL> menuClickPath;
  uint32_t spaceCount;
  array<unsigned_long,_2UL> squeezeValuePath;
  XrSessionCreateInfo createInfo;
  array<unsigned_long,_2UL> triggerValuePath;
  array<unsigned_long,_2UL> bClickPath;
  array<unsigned_long,_2UL> squeezeClickPath;
  array<unsigned_long,_2UL> squeezeForcePath;
  allocator_type local_241;
  XrAction local_240;
  undefined1 local_238 [16];
  pointer local_228;
  InputState *pIStack_220;
  array<unsigned_long,_2UL> *local_208;
  array<unsigned_long,_2UL> *local_200;
  undefined8 local_1f8;
  XrPath local_1f0;
  undefined8 local_1e8;
  array<unsigned_long,_2UL> *local_1e0;
  vector<XrSpace_T*,std::allocator<XrSpace_T*>> *local_1d8;
  string local_1d0;
  XrSession *local_1b0;
  XrSpace_T *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [24];
  undefined5 uStack_180;
  undefined3 uStack_17b;
  XrActionSuggestedBinding *local_178;
  undefined8 uStack_170;
  XrActionSuggestedBinding local_168;
  XrAction local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  array<unsigned_long,_2UL> *local_140;
  XrAction local_138;
  array<unsigned_long,_2UL> *local_130;
  XrAction local_128;
  array<unsigned_long,_2UL> *local_120;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined2 local_100;
  undefined1 local_fe;
  pointer *local_f8;
  pointer local_f0;
  pointer local_e8 [2];
  long *local_d8;
  XrActionSuggestedBinding *local_d0;
  undefined8 local_c8;
  InputState *local_b8;
  void *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  array<unsigned_long,_2UL> *local_98;
  void *local_90;
  undefined8 local_88;
  void *local_80;
  undefined8 local_78;
  string local_70;
  string local_50;
  
  if (this->m_instance == (XrInstance)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Check failed","");
    Throw(&local_50,"m_instance != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:553"
         );
  }
  if (this->m_session != (XrSession)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Check failed","");
    Throw(&local_70,"m_session == XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:554"
         );
  }
  Fmt_abi_cxx11_((string *)local_198,"Creating session...");
  Log::Write(Verbose,(string *)local_198);
  ppXVar1 = &this->m_session;
  pcVar7 = local_198 + 0x10;
  if ((pointer)local_198._0_8_ != pcVar7) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_198._16_8_ = (XrAction)0x0;
  _uStack_180 = 0;
  local_198._0_8_ = (pointer)0x8;
  local_198._8_8_ = (void *)0x0;
  iVar10 = (*((this->m_graphicsPlugin).
              super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_IGraphicsPlugin[5])();
  local_198._8_8_ = CONCAT44(extraout_var,iVar10);
  _uStack_180 = this->m_systemId;
  XVar11 = xrCreateSession(this->m_instance,local_198,ppXVar1);
  if (XVar11 < XR_SUCCESS) {
    originator = "xrCreateSession(m_instance, &createInfo, &m_session)";
    pcVar13 = 
    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:562"
    ;
  }
  else {
    if (*ppXVar1 == (XrSession)0x0) {
      local_198._16_8_ = 0x6166206b63656843;
      local_198._8_8_ = (void *)0xc;
      uStack_180 = 0x64656c69;
      local_198._0_8_ = pcVar7;
      Throw((string *)local_198,"m_session != XR_NULL_HANDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:318"
           );
    }
    XVar11 = xrEnumerateReferenceSpaces(*ppXVar1,0,&local_1d0,0);
    if (XVar11 < XR_SUCCESS) {
      originator = "xrEnumerateReferenceSpaces(m_session, 0, &spaceCount, nullptr)";
      pcVar13 = 
      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:321"
      ;
    }
    else {
      std::vector<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_>::vector
                ((vector<XrReferenceSpaceType,_std::allocator<XrReferenceSpaceType>_> *)local_238,
                 (ulong)(uint)local_1d0._M_dataplus._M_p,(allocator_type *)local_198);
      XVar11 = xrEnumerateReferenceSpaces
                         (*ppXVar1,(uint)local_1d0._M_dataplus._M_p,&local_1d0,local_238._0_8_);
      if (XVar11 < XR_SUCCESS) {
        ThrowXrResult(XVar11,
                      "xrEnumerateReferenceSpaces(m_session, spaceCount, &spaceCount, spaces.data())"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:323"
                     );
      }
      Fmt_abi_cxx11_((string *)local_198,"Available reference spaces: %d",
                     (ulong)(uint)local_1d0._M_dataplus._M_p);
      Log::Write(Info,(string *)local_198);
      local_1b0 = ppXVar1;
      if ((pointer)local_198._0_8_ != pcVar7) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
      }
      pXVar8 = (XrActionSuggestedBinding *)CONCAT44(local_238._12_4_,local_238._8_4_);
      if ((XrActionSuggestedBinding *)local_238._0_8_ != pXVar8) {
        pXVar16 = (XrActionSuggestedBinding *)local_238._0_8_;
        do {
          iVar10 = *(int *)&pXVar16->action;
          if (iVar10 < 0x3b9ca2a8) {
            if (iVar10 < 3) {
              pcVar13 = "XR_REFERENCE_SPACE_TYPE_VIEW";
              if (iVar10 != 1) {
                if (iVar10 == 2) {
                  pcVar13 = "XR_REFERENCE_SPACE_TYPE_LOCAL";
                }
                else {
LAB_0010e51b:
                  pcVar13 = "Unknown XrReferenceSpaceType";
                }
              }
            }
            else if (iVar10 == 3) {
              pcVar13 = "XR_REFERENCE_SPACE_TYPE_STAGE";
            }
            else {
              if (iVar10 != 0x3b9b5e70) goto LAB_0010e51b;
              pcVar13 = "XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT";
            }
          }
          else if (iVar10 < 0x3ba14a10) {
            if (iVar10 == 0x3b9ca2a8) {
              pcVar13 = "XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO";
            }
            else {
              if (iVar10 != 0x3b9ce8f8) goto LAB_0010e51b;
              pcVar13 = "XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML";
            }
          }
          else if (iVar10 == 0x3ba14a10) {
            pcVar13 = "XR_REFERENCE_SPACE_TYPE_LOCAL_FLOOR";
          }
          else {
            if (iVar10 != 0x7fffffff) goto LAB_0010e51b;
            pcVar13 = "XR_REFERENCE_SPACE_TYPE_MAX_ENUM";
          }
          Fmt_abi_cxx11_((string *)local_198,"  Name: %s",pcVar13);
          Log::Write(Verbose,(string *)local_198);
          if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
          }
          pXVar16 = (XrActionSuggestedBinding *)((long)&pXVar16->action + 4);
        } while (pXVar16 != pXVar8);
      }
      if ((XrActionSuggestedBinding *)local_238._0_8_ != (XrActionSuggestedBinding *)0x0) {
        operator_delete((void *)local_238._0_8_,(long)local_228 - local_238._0_8_);
      }
      memset(local_198,0,0xd8);
      local_198._0_4_ = 0x1c;
      local_198[0x10] = 'g';
      local_198[0x11] = 'a';
      local_198[0x12] = 'm';
      local_198[0x13] = 'e';
      local_198[0x14] = 'p';
      local_198[0x15] = 'l';
      local_198[0x16] = 'a';
      local_198[0x17] = 'y';
      _uStack_180 = 0;
      local_178 = (XrActionSuggestedBinding *)0x0;
      uStack_170._0_4_ = 0.0;
      uStack_170._4_4_ = 0.0;
      local_168.action = (XrAction)0x0;
      local_168.binding = 0;
      local_158 = (XrAction)0x0;
      uStack_150 = 0;
      memcpy(&local_148,"Gameplay",0x80);
      local_c8 = (XrActionSuggestedBinding *)((ulong)local_c8._4_4_ << 0x20);
      XVar11 = xrCreateActionSet(this->m_instance,local_198,&this->m_input);
      if (XVar11 < XR_SUCCESS) {
        originator = "xrCreateActionSet(m_instance, &actionSetInfo, &m_input.actionSet)";
        pcVar13 = 
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:350"
        ;
      }
      else {
        paVar2 = &(this->m_input).handSubactionPath;
        local_b8 = &this->m_input;
        XVar11 = xrStringToPath(this->m_instance,"/user/hand/left",paVar2);
        if (XVar11 < XR_SUCCESS) {
          originator = 
          "xrStringToPath(m_instance, \"/user/hand/left\", &m_input.handSubactionPath[Side::LEFT])";
          pcVar13 = 
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:354"
          ;
        }
        else {
          XVar11 = xrStringToPath(this->m_instance,"/user/hand/right",
                                  (this->m_input).handSubactionPath._M_elems + 1);
          if (XVar11 < XR_SUCCESS) {
            originator = 
            "xrStringToPath(m_instance, \"/user/hand/right\", &m_input.handSubactionPath[Side::RIGHT])"
            ;
            pcVar13 = 
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:355"
            ;
          }
          else {
            memset(local_198,0,0xe0);
            local_198._0_4_ = 0x1d;
            local_148 = (XrAction)CONCAT44(local_148._4_4_,2);
            local_198[0x10] = 'g';
            local_198[0x11] = 'r';
            local_198[0x12] = 'a';
            local_198[0x13] = 'b';
            local_198[0x14] = '_';
            local_198[0x15] = 'o';
            local_198[0x16] = 'b';
            local_198[0x17] = 'j';
            _uStack_180 = 0x746365;
            local_178 = (XrActionSuggestedBinding *)0x0;
            uStack_170._0_4_ = 0.0;
            uStack_170._4_4_ = 0.0;
            local_168.action = (XrAction)0x0;
            local_168.binding = 0;
            local_158 = (XrAction)0x0;
            uStack_150 = 0;
            memcpy(&local_138,"Grab Object",0x80);
            local_148 = (XrAction)CONCAT44(2,(undefined4)local_148);
            local_1d8 = (vector<XrSpace_T*,std::allocator<XrSpace_T*>> *)&(this->m_input).grabAction
            ;
            local_140 = paVar2;
            XVar11 = xrCreateAction((this->m_input).actionSet,local_198);
            if (XVar11 < XR_SUCCESS) {
              originator = "xrCreateAction(m_input.actionSet, &actionInfo, &m_input.grabAction)";
              pcVar13 = 
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:366"
              ;
            }
            else {
              local_148 = (XrAction)CONCAT44(local_148._4_4_,4);
              local_158 = (XrAction)0x0;
              uStack_150 = 0;
              local_168.action = (XrAction)0x0;
              local_168.binding = 0;
              local_178 = (XrActionSuggestedBinding *)0x0;
              uStack_170._0_4_ = 0.0;
              uStack_170._4_4_ = 0.0;
              local_198[0x10] = 'h';
              local_198[0x11] = 'a';
              local_198[0x12] = 'n';
              local_198[0x13] = 'd';
              local_198[0x14] = '_';
              local_198[0x15] = 'p';
              local_198[0x16] = 'o';
              local_198[0x17] = 's';
              _uStack_180 = 0x65;
              memcpy(&local_138,"Hand Pose",0x80);
              local_148 = (XrAction)CONCAT44(2,(undefined4)local_148);
              ppXVar3 = &(this->m_input).poseAction;
              local_140 = paVar2;
              XVar11 = xrCreateAction((this->m_input).actionSet,local_198);
              if (XVar11 < XR_SUCCESS) {
                originator = "xrCreateAction(m_input.actionSet, &actionInfo, &m_input.poseAction)";
                pcVar13 = 
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:374"
                ;
              }
              else {
                local_148 = (XrAction)CONCAT44(local_148._4_4_,100);
                local_158 = (XrAction)0x0;
                uStack_150 = 0;
                local_168.action = (XrAction)0x0;
                local_168.binding = 0;
                local_178 = (XrActionSuggestedBinding *)0x0;
                uStack_170._0_4_ = 0.0;
                uStack_170._4_4_ = 0.0;
                local_198[0x10] = 'v';
                local_198[0x11] = 'i';
                local_198[0x12] = 'b';
                local_198[0x13] = 'r';
                local_198[0x14] = 'a';
                local_198[0x15] = 't';
                local_198[0x16] = 'e';
                local_198[0x17] = '_';
                _uStack_180 = 0x646e6168;
                memcpy(&local_138,"Vibrate Hand",0x80);
                local_148 = (XrAction)CONCAT44(2,(undefined4)local_148);
                ppXVar4 = &(this->m_input).vibrateAction;
                local_140 = paVar2;
                XVar11 = xrCreateAction((this->m_input).actionSet,local_198,ppXVar4);
                if (XVar11 < XR_SUCCESS) {
                  originator = 
                  "xrCreateAction(m_input.actionSet, &actionInfo, &m_input.vibrateAction)";
                  pcVar13 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:382"
                  ;
                }
                else {
                  local_148 = (XrAction)CONCAT44(local_148._4_4_,1);
                  local_158 = (XrAction)0x0;
                  uStack_150 = 0;
                  local_168.action = (XrAction)0x0;
                  local_168.binding = 0;
                  local_178 = (XrActionSuggestedBinding *)0x0;
                  uStack_170._0_4_ = 0.0;
                  uStack_170._4_4_ = 0.0;
                  local_198[0x10] = 'q';
                  local_198[0x11] = 'u';
                  local_198[0x12] = 'i';
                  local_198[0x13] = 't';
                  local_198[0x14] = '_';
                  local_198[0x15] = 's';
                  local_198[0x16] = 'e';
                  local_198[0x17] = 's';
                  _uStack_180 = 0x6e6f6973;
                  memcpy(&local_138,"Quit Session",0x80);
                  local_148 = (XrAction)((ulong)local_148 & 0xffffffff);
                  local_140 = (array<unsigned_long,_2UL> *)0x0;
                  ppXVar5 = &(this->m_input).quitAction;
                  XVar11 = xrCreateAction((this->m_input).actionSet,local_198,ppXVar5);
                  if (XVar11 < XR_SUCCESS) {
                    originator = 
                    "xrCreateAction(m_input.actionSet, &actionInfo, &m_input.quitAction)";
                    pcVar13 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:392"
                    ;
                  }
                  else {
                    XVar11 = xrStringToPath(this->m_instance,"/user/hand/left/input/select/click",
                                            &local_1d0);
                    pvVar9 = local_1d8;
                    if (XVar11 < XR_SUCCESS) {
                      originator = 
                      "xrStringToPath(m_instance, \"/user/hand/left/input/select/click\", &selectPath[Side::LEFT])"
                      ;
                      pcVar13 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:404"
                      ;
                    }
                    else {
                      XVar11 = xrStringToPath(this->m_instance,"/user/hand/right/input/select/click"
                                              ,&local_1d0._M_string_length);
                      if (XVar11 < XR_SUCCESS) {
                        originator = 
                        "xrStringToPath(m_instance, \"/user/hand/right/input/select/click\", &selectPath[Side::RIGHT])"
                        ;
                        pcVar13 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:405"
                        ;
                      }
                      else {
                        XVar11 = xrStringToPath(this->m_instance,
                                                "/user/hand/left/input/squeeze/value",&local_1a8);
                        if (XVar11 < XR_SUCCESS) {
                          originator = 
                          "xrStringToPath(m_instance, \"/user/hand/left/input/squeeze/value\", &squeezeValuePath[Side::LEFT])"
                          ;
                          pcVar13 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:406"
                          ;
                        }
                        else {
                          XVar11 = xrStringToPath(this->m_instance,
                                                  "/user/hand/right/input/squeeze/value",&local_1a0)
                          ;
                          if (XVar11 < XR_SUCCESS) {
                            originator = 
                            "xrStringToPath(m_instance, \"/user/hand/right/input/squeeze/value\", &squeezeValuePath[Side::RIGHT])"
                            ;
                            pcVar13 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:407"
                            ;
                          }
                          else {
                            XVar11 = xrStringToPath(this->m_instance,
                                                    "/user/hand/left/input/squeeze/force",&local_80)
                            ;
                            if (XVar11 < XR_SUCCESS) {
                              originator = 
                              "xrStringToPath(m_instance, \"/user/hand/left/input/squeeze/force\", &squeezeForcePath[Side::LEFT])"
                              ;
                              pcVar13 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:408"
                              ;
                            }
                            else {
                              XVar11 = xrStringToPath(this->m_instance,
                                                      "/user/hand/right/input/squeeze/force",
                                                      &local_78);
                              if (XVar11 < XR_SUCCESS) {
                                originator = 
                                "xrStringToPath(m_instance, \"/user/hand/right/input/squeeze/force\", &squeezeForcePath[Side::RIGHT])"
                                ;
                                pcVar13 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:409"
                                ;
                              }
                              else {
                                XVar11 = xrStringToPath(this->m_instance,
                                                        "/user/hand/left/input/squeeze/click",
                                                        &local_90);
                                if (XVar11 < XR_SUCCESS) {
                                  originator = 
                                  "xrStringToPath(m_instance, \"/user/hand/left/input/squeeze/click\", &squeezeClickPath[Side::LEFT])"
                                  ;
                                  pcVar13 = 
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:410"
                                  ;
                                }
                                else {
                                  XVar11 = xrStringToPath(this->m_instance,
                                                          "/user/hand/right/input/squeeze/click",
                                                          &local_88);
                                  if (XVar11 < XR_SUCCESS) {
                                    originator = 
                                    "xrStringToPath(m_instance, \"/user/hand/right/input/squeeze/click\", &squeezeClickPath[Side::RIGHT])"
                                    ;
                                    pcVar13 = 
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:411"
                                    ;
                                  }
                                  else {
                                    XVar11 = xrStringToPath(this->m_instance,
                                                            "/user/hand/left/input/grip/pose",
                                                            &local_1f8);
                                    if (XVar11 < XR_SUCCESS) {
                                      originator = 
                                      "xrStringToPath(m_instance, \"/user/hand/left/input/grip/pose\", &posePath[Side::LEFT])"
                                      ;
                                      pcVar13 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:412"
                                      ;
                                    }
                                    else {
                                      XVar11 = xrStringToPath(this->m_instance,
                                                              "/user/hand/right/input/grip/pose",
                                                              &local_1f0);
                                      if (XVar11 < XR_SUCCESS) {
                                        originator = 
                                        "xrStringToPath(m_instance, \"/user/hand/right/input/grip/pose\", &posePath[Side::RIGHT])"
                                        ;
                                        pcVar13 = 
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:413"
                                        ;
                                      }
                                      else {
                                        XVar11 = xrStringToPath(this->m_instance,
                                                                "/user/hand/left/output/haptic",
                                                                &local_208);
                                        if (XVar11 < XR_SUCCESS) {
                                          originator = 
                                          "xrStringToPath(m_instance, \"/user/hand/left/output/haptic\", &hapticPath[Side::LEFT])"
                                          ;
                                          pcVar13 = 
                                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:414"
                                          ;
                                        }
                                        else {
                                          XVar11 = xrStringToPath(this->m_instance,
                                                                  "/user/hand/right/output/haptic",
                                                                  &local_200);
                                          if (XVar11 < XR_SUCCESS) {
                                            originator = 
                                            "xrStringToPath(m_instance, \"/user/hand/right/output/haptic\", &hapticPath[Side::RIGHT])"
                                            ;
                                            pcVar13 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:415"
                                            ;
                                          }
                                          else {
                                            XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                        
                                                  "/user/hand/left/input/menu/click",&local_1e8);
                                            if (XVar11 < XR_SUCCESS) {
                                              originator = 
                                              "xrStringToPath(m_instance, \"/user/hand/left/input/menu/click\", &menuClickPath[Side::LEFT])"
                                              ;
                                              pcVar13 = 
                                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:416"
                                              ;
                                            }
                                            else {
                                              XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                            
                                                  "/user/hand/right/input/menu/click",&local_1e0);
                                              if (XVar11 < XR_SUCCESS) {
                                                originator = 
                                                "xrStringToPath(m_instance, \"/user/hand/right/input/menu/click\", &menuClickPath[Side::RIGHT])"
                                                ;
                                                pcVar13 = 
                                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:417"
                                                ;
                                              }
                                              else {
                                                XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                
                                                  "/user/hand/left/input/b/click",&local_a0);
                                                if (XVar11 < XR_SUCCESS) {
                                                  originator = 
                                                  "xrStringToPath(m_instance, \"/user/hand/left/input/b/click\", &bClickPath[Side::LEFT])"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:418"
                                                  ;
                                                }
                                                else {
                                                  XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                    
                                                  "/user/hand/right/input/b/click",&local_98);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrStringToPath(m_instance, \"/user/hand/right/input/b/click\", &bClickPath[Side::RIGHT])"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:419"
                                                  ;
                                                  }
                                                  else {
                                                    XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                        
                                                  "/user/hand/left/input/trigger/value",&local_b0);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrStringToPath(m_instance, \"/user/hand/left/input/trigger/value\", &triggerValuePath[Side::LEFT])"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:420"
                                                  ;
                                                  }
                                                  else {
                                                    XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                        
                                                  "/user/hand/right/input/trigger/value",&local_a8);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrStringToPath(m_instance, \"/user/hand/right/input/trigger/value\", &triggerValuePath[Side::RIGHT])"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:421"
                                                  ;
                                                  }
                                                  else {
                                                    XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                        
                                                  "/interaction_profiles/khr/simple_controller",
                                                  &local_240);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrStringToPath(m_instance, \"/interaction_profiles/khr/simple_controller\", &khrSimpleInteractionProfilePath)"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:426"
                                                  ;
                                                  }
                                                  else {
                                                    local_198._0_8_ = *(undefined8 *)pvVar9;
                                                    _uStack_180 = local_1d0._M_string_length;
                                                    local_178 = (XrActionSuggestedBinding *)*ppXVar3
                                                    ;
                                                    uStack_170._0_4_ = (float)local_1f8;
                                                    uStack_170._4_4_ = local_1f8._4_4_;
                                                    local_168.binding = local_1f0;
                                                    local_158 = *ppXVar5;
                                                    uStack_150 = local_1e8;
                                                    local_140 = local_1e0;
                                                    local_138 = *ppXVar4;
                                                    local_130 = local_208;
                                                    local_120 = local_200;
                                                    __l._M_len = 8;
                                                    __l._M_array = (iterator)local_198;
                                                    local_198._16_8_ = local_198._0_8_;
                                                    local_168.action = (XrAction)local_178;
                                                    local_148 = local_158;
                                                    local_128 = local_138;
                                                    std::
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  ::vector((
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  *)local_238,__l,&local_241);
                                                  local_198._8_8_ = (void *)0x0;
                                                  local_198._0_8_ = (pointer)0x33;
                                                  local_198._16_8_ = local_240;
                                                  local_178 = (XrActionSuggestedBinding *)
                                                              local_238._0_8_;
                                                  _uStack_180 = (ulong)(CONCAT44(local_238._12_4_,
                                                                                 local_238._8_4_) -
                                                                       local_238._0_8_) >> 4 &
                                                                0xffffffff;
                                                  XVar11 = xrSuggestInteractionProfileBindings
                                                                     (this->m_instance);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    ThrowXrResult(XVar11,
                                                  "xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:440"
                                                  );
                                                  }
                                                  if ((XrActionSuggestedBinding *)local_238._0_8_ !=
                                                      (XrActionSuggestedBinding *)0x0) {
                                                    operator_delete((void *)local_238._0_8_,
                                                                    (long)local_228 -
                                                                    local_238._0_8_);
                                                  }
                                                  XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                    
                                                  "/interaction_profiles/oculus/touch_controller",
                                                  &local_240);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrStringToPath(m_instance, \"/interaction_profiles/oculus/touch_controller\", &oculusTouchInteractionProfilePath)"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:446"
                                                  ;
                                                  }
                                                  else {
                                                    local_198._0_8_ = *(undefined8 *)pvVar9;
                                                    local_198._8_8_ = local_1a8;
                                                    _uStack_180 = local_1a0;
                                                    local_178 = (XrActionSuggestedBinding *)*ppXVar3
                                                    ;
                                                    uStack_170._0_4_ = (float)local_1f8;
                                                    uStack_170._4_4_ = local_1f8._4_4_;
                                                    local_168.binding = local_1f0;
                                                    local_158 = *ppXVar5;
                                                    uStack_150 = local_1e8;
                                                    local_148 = *ppXVar4;
                                                    local_140 = local_208;
                                                    local_130 = local_200;
                                                    __l_00._M_len = 7;
                                                    __l_00._M_array = (iterator)local_198;
                                                    local_198._16_8_ = local_198._0_8_;
                                                    local_168.action = (XrAction)local_178;
                                                    local_138 = local_148;
                                                    std::
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  ::vector((
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  *)local_238,__l_00,&local_241);
                                                  local_198._8_8_ = (void *)0x0;
                                                  local_198._0_8_ = (pointer)0x33;
                                                  local_198._16_8_ = local_240;
                                                  local_178 = (XrActionSuggestedBinding *)
                                                              local_238._0_8_;
                                                  _uStack_180 = (ulong)(CONCAT44(local_238._12_4_,
                                                                                 local_238._8_4_) -
                                                                       local_238._0_8_) >> 4 &
                                                                0xffffffff;
                                                  XVar11 = xrSuggestInteractionProfileBindings
                                                                     (this->m_instance);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    ThrowXrResult(XVar11,
                                                  "xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:458"
                                                  );
                                                  }
                                                  if ((XrActionSuggestedBinding *)local_238._0_8_ !=
                                                      (XrActionSuggestedBinding *)0x0) {
                                                    operator_delete((void *)local_238._0_8_,
                                                                    (long)local_228 -
                                                                    local_238._0_8_);
                                                  }
                                                  XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                    
                                                  "/interaction_profiles/htc/vive_controller",
                                                  &local_240);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrStringToPath(m_instance, \"/interaction_profiles/htc/vive_controller\", &viveControllerInteractionProfilePath)"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:464"
                                                  ;
                                                  }
                                                  else {
                                                    local_198._0_8_ = *(undefined8 *)pvVar9;
                                                    local_198._8_8_ = local_b0;
                                                    _uStack_180 = local_a8;
                                                    local_178 = (XrActionSuggestedBinding *)*ppXVar3
                                                    ;
                                                    uStack_170._0_4_ = (float)local_1f8;
                                                    uStack_170._4_4_ = local_1f8._4_4_;
                                                    local_168.binding = local_1f0;
                                                    local_158 = *ppXVar5;
                                                    uStack_150 = local_1e8;
                                                    local_140 = local_1e0;
                                                    local_138 = *ppXVar4;
                                                    local_130 = local_208;
                                                    local_120 = local_200;
                                                    __l_01._M_len = 8;
                                                    __l_01._M_array = (iterator)local_198;
                                                    local_198._16_8_ = local_198._0_8_;
                                                    local_168.action = (XrAction)local_178;
                                                    local_148 = local_158;
                                                    local_128 = local_138;
                                                    std::
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  ::vector((
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  *)local_238,__l_01,&local_241);
                                                  local_198._8_8_ = (void *)0x0;
                                                  local_198._0_8_ = (pointer)0x33;
                                                  local_198._16_8_ = local_240;
                                                  local_178 = (XrActionSuggestedBinding *)
                                                              local_238._0_8_;
                                                  _uStack_180 = (ulong)(CONCAT44(local_238._12_4_,
                                                                                 local_238._8_4_) -
                                                                       local_238._0_8_) >> 4 &
                                                                0xffffffff;
                                                  XVar11 = xrSuggestInteractionProfileBindings
                                                                     (this->m_instance);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    ThrowXrResult(XVar11,
                                                  "xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:477"
                                                  );
                                                  }
                                                  if ((XrActionSuggestedBinding *)local_238._0_8_ !=
                                                      (XrActionSuggestedBinding *)0x0) {
                                                    operator_delete((void *)local_238._0_8_,
                                                                    (long)local_228 -
                                                                    local_238._0_8_);
                                                  }
                                                  XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                    
                                                  "/interaction_profiles/valve/index_controller",
                                                  &local_240);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrStringToPath(m_instance, \"/interaction_profiles/valve/index_controller\", &indexControllerInteractionProfilePath)"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:484"
                                                  ;
                                                  }
                                                  else {
                                                    local_198._0_8_ = *(undefined8 *)pvVar9;
                                                    local_198._8_8_ = local_80;
                                                    _uStack_180 = local_78;
                                                    local_178 = (XrActionSuggestedBinding *)*ppXVar3
                                                    ;
                                                    uStack_170._0_4_ = (float)local_1f8;
                                                    uStack_170._4_4_ = local_1f8._4_4_;
                                                    local_168.binding = local_1f0;
                                                    local_158 = *ppXVar5;
                                                    uStack_150 = local_a0;
                                                    local_140 = local_98;
                                                    local_138 = *ppXVar4;
                                                    local_130 = local_208;
                                                    local_120 = local_200;
                                                    __l_02._M_len = 8;
                                                    __l_02._M_array = (iterator)local_198;
                                                    local_198._16_8_ = local_198._0_8_;
                                                    local_168.action = (XrAction)local_178;
                                                    local_148 = local_158;
                                                    local_128 = local_138;
                                                    std::
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  ::vector((
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  *)local_238,__l_02,&local_241);
                                                  local_198._8_8_ = (void *)0x0;
                                                  local_198._0_8_ = (pointer)0x33;
                                                  local_198._16_8_ = local_240;
                                                  local_178 = (XrActionSuggestedBinding *)
                                                              local_238._0_8_;
                                                  _uStack_180 = (ulong)(CONCAT44(local_238._12_4_,
                                                                                 local_238._8_4_) -
                                                                       local_238._0_8_) >> 4 &
                                                                0xffffffff;
                                                  XVar11 = xrSuggestInteractionProfileBindings
                                                                     (this->m_instance);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    ThrowXrResult(XVar11,
                                                  "xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:497"
                                                  );
                                                  }
                                                  if ((XrActionSuggestedBinding *)local_238._0_8_ !=
                                                      (XrActionSuggestedBinding *)0x0) {
                                                    operator_delete((void *)local_238._0_8_,
                                                                    (long)local_228 -
                                                                    local_238._0_8_);
                                                  }
                                                  XVar11 = xrStringToPath(this->m_instance,
                                                                                                                                                    
                                                  "/interaction_profiles/microsoft/motion_controller"
                                                  ,&local_240);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrStringToPath(m_instance, \"/interaction_profiles/microsoft/motion_controller\", &microsoftMixedRealityInteractionProfilePath)"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:504"
                                                  ;
                                                  }
                                                  else {
                                                    local_198._0_8_ = *(undefined8 *)pvVar9;
                                                    local_198._8_8_ = local_90;
                                                    _uStack_180 = local_88;
                                                    local_178 = (XrActionSuggestedBinding *)*ppXVar3
                                                    ;
                                                    uStack_170._0_4_ = (float)local_1f8;
                                                    uStack_170._4_4_ = local_1f8._4_4_;
                                                    local_168.binding = local_1f0;
                                                    local_158 = *ppXVar5;
                                                    uStack_150 = local_1e8;
                                                    local_140 = local_1e0;
                                                    local_138 = *ppXVar4;
                                                    local_130 = local_208;
                                                    local_120 = local_200;
                                                    __l_03._M_len = 8;
                                                    __l_03._M_array = (iterator)local_198;
                                                    local_198._16_8_ = local_198._0_8_;
                                                    local_168.action = (XrAction)local_178;
                                                    local_148 = local_158;
                                                    local_128 = local_138;
                                                    std::
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  ::vector((
                                                  vector<XrActionSuggestedBinding,_std::allocator<XrActionSuggestedBinding>_>
                                                  *)local_238,__l_03,&local_241);
                                                  local_198._8_8_ = (void *)0x0;
                                                  local_198._0_8_ = (pointer)0x33;
                                                  local_198._16_8_ = local_240;
                                                  local_178 = (XrActionSuggestedBinding *)
                                                              local_238._0_8_;
                                                  _uStack_180 = (ulong)(CONCAT44(local_238._12_4_,
                                                                                 local_238._8_4_) -
                                                                       local_238._0_8_) >> 4 &
                                                                0xffffffff;
                                                  XVar11 = xrSuggestInteractionProfileBindings
                                                                     (this->m_instance);
                                                  ppXVar1 = local_1b0;
                                                  if (XVar11 < XR_SUCCESS) {
                                                    ThrowXrResult(XVar11,
                                                  "xrSuggestInteractionProfileBindings(m_instance, &suggestedBindings)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:517"
                                                  );
                                                  }
                                                  if ((XrActionSuggestedBinding *)local_238._0_8_ !=
                                                      (XrActionSuggestedBinding *)0x0) {
                                                    operator_delete((void *)local_238._0_8_,
                                                                    (long)local_228 -
                                                                    local_238._0_8_);
                                                  }
                                                  local_198._8_8_ = (void *)0x0;
                                                  local_168.action = (XrAction)0x0;
                                                  local_168.binding = 0;
                                                  local_178 = (XrActionSuggestedBinding *)0x0;
                                                  local_198._0_8_ = (pointer)0x26;
                                                  local_198._16_8_ = (this->m_input).poseAction;
                                                  uStack_170._0_4_ = 0.0;
                                                  uStack_170._4_4_ = 1.0;
                                                  _uStack_180 = (this->m_input).handSubactionPath.
                                                                _M_elems[0];
                                                  XVar11 = xrCreateActionSpace(this->m_session,
                                                                               local_198,
                                                                               &(this->m_input).
                                                                                handSpace);
                                                  if (XVar11 < XR_SUCCESS) {
                                                    originator = 
                                                  "xrCreateActionSpace(m_session, &actionSpaceInfo, &m_input.handSpace[Side::LEFT])"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:523"
                                                  ;
                                                  }
                                                  else {
                                                    _uStack_180 = (this->m_input).handSubactionPath.
                                                                  _M_elems[1];
                                                    XVar11 = xrCreateActionSpace(this->m_session,
                                                                                 local_198,
                                                                                 (this->m_input).
                                                                                 handSpace._M_elems
                                                                                 + 1);
                                                    if (XVar11 < XR_SUCCESS) {
                                                      originator = 
                                                  "xrCreateActionSpace(m_session, &actionSpaceInfo, &m_input.handSpace[Side::RIGHT])"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:525"
                                                  ;
                                                  }
                                                  else {
                                                    local_238._0_8_ =
                                                         (XrActionSuggestedBinding *)0x3c;
                                                    local_238._8_4_ = 0;
                                                    local_238._12_4_ = 0;
                                                    local_228 = (pointer)0x1;
                                                    pIStack_220 = local_b8;
                                                    XVar11 = xrAttachSessionActionSets(*ppXVar1);
                                                    if (XVar11 < XR_SUCCESS) {
                                                      originator = 
                                                  "xrAttachSessionActionSets(m_session, &attachInfo)"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:530"
                                                  ;
                                                  }
                                                  else {
                                                    local_198._0_8_ = local_198 + 0x10;
                                                    if (*ppXVar1 == (XrSession)0x0) {
                                                      local_198._16_8_ = 0x6166206b63656843;
                                                      local_198._8_8_ = (void *)0xc;
                                                      uStack_180 = 0x64656c69;
                                                      Throw((string *)local_198,
                                                            "m_session != XR_NULL_HANDLE",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:534"
                                                  );
                                                  }
                                                  local_178 = &local_168;
                                                  local_198._16_8_ = (XrAction)0x6e6f724677656956;
                                                  uStack_180._0_2_ = 0x74;
                                                  local_198._8_8_ = (void *)0x9;
                                                  local_168.action =
                                                       (XrAction)
                                                       CONCAT26(local_168.action._6_2_,0x6c61636f4c)
                                                  ;
                                                  uStack_170._0_4_ = 7.00649e-45;
                                                  uStack_170._4_4_ = 0.0;
                                                  local_158 = (XrAction)&local_148;
                                                  local_148 = (XrAction)
                                                              CONCAT26(local_148._6_2_,0x6567617453)
                                                  ;
                                                  uStack_150 = 5;
                                                  local_138 = (XrAction)&local_128;
                                                  local_128 = (XrAction)0x66654c6567617453;
                                                  local_120 = (array<unsigned_long,_2UL> *)
                                                              CONCAT62(local_120._2_6_,0x74);
                                                  local_130 = (array<unsigned_long,_2UL> *)0x9;
                                                  local_118 = &local_108;
                                                  local_108 = 0x6769526567617453;
                                                  local_100 = 0x7468;
                                                  local_110 = 10;
                                                  local_fe = 0;
                                                  local_f8 = local_e8;
                                                  local_238._0_8_ = (pointer)0x10;
                                                  local_f8 = (pointer *)
                                                             std::__cxx11::string::_M_create
                                                                       ((ulong *)&local_f8,
                                                                        (ulong)local_238);
                                                  local_e8[0] = (pointer)local_238._0_8_;
                                                  *local_f8 = (pointer)0x66654c6567617453;
                                                  local_f8[1] = (pointer)0x64657461746f5274;
                                                  local_f0 = (pointer)local_238._0_8_;
                                                  *(char *)((long)local_f8 + local_238._0_8_) = '\0'
                                                  ;
                                                  plVar15 = &local_c8;
                                                  local_238._0_8_ = (XrActionSuggestedBinding *)0x11
                                                  ;
                                                  local_d8 = plVar15;
                                                  local_d8 = (long *)std::__cxx11::string::_M_create
                                                                               ((ulong *)&local_d8,
                                                                                (ulong)local_238);
                                                  local_c8 = (XrActionSuggestedBinding *)
                                                             local_238._0_8_;
                                                  *local_d8 = 0x6769526567617453;
                                                  local_d8[1] = 0x657461746f527468;
                                                  *(char *)(local_d8 + 2) = 'd';
                                                  local_d0 = (XrActionSuggestedBinding *)
                                                             local_238._0_8_;
                                                  *(char *)((long)local_d8 + local_238._0_8_) = '\0'
                                                  ;
                                                  local_1d8 = (
                                                  vector<XrSpace_T*,std::allocator<XrSpace_T*>> *)
                                                  &this->m_visualizedSpaces;
                                                  lVar14 = 0;
                                                  do {
                                                    GetXrReferenceSpaceCreateInfo
                                                              ((XrReferenceSpaceCreateInfo *)
                                                               local_238,
                                                               (string *)(local_198 + lVar14));
                                                    uVar12 = xrCreateReferenceSpace
                                                                       (*local_1b0,
                                                                        (XrReferenceSpaceCreateInfo
                                                                         *)local_238,&local_1a8);
                                                    if ((int)uVar12 < 0) {
                                                      Fmt_abi_cxx11_(&local_1d0,
                                                                                                                                          
                                                  "Failed to create reference space %s with error %d"
                                                  ,(((string *)(local_198 + lVar14))->_M_dataplus).
                                                   _M_p,(ulong)uVar12);
                                                  Log::Write(Warning,&local_1d0);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)CONCAT44(local_1d0._M_dataplus._M_p._4_4_,
                                                             (uint)local_1d0._M_dataplus._M_p) !=
                                                  &local_1d0.field_2) {
                                                    operator_delete((undefined1 *)
                                                                    CONCAT44(local_1d0._M_dataplus.
                                                                             _M_p._4_4_,
                                                                             (uint)local_1d0.
                                                                                   _M_dataplus._M_p)
                                                                    ,local_1d0.field_2.
                                                                     _M_allocated_capacity + 1);
                                                  }
                                                  }
                                                  else {
                                                    __position._M_current =
                                                         (this->m_visualizedSpaces).
                                                                                                                  
                                                  super__Vector_base<XrSpace_T_*,_std::allocator<XrSpace_T_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  if (__position._M_current ==
                                                      (this->m_visualizedSpaces).
                                                                                                            
                                                  super__Vector_base<XrSpace_T_*,_std::allocator<XrSpace_T_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ) {
                                                    std::
                                                  vector<XrSpace_T*,std::allocator<XrSpace_T*>>::
                                                  _M_realloc_insert<XrSpace_T*const&>
                                                            (local_1d8,__position,&local_1a8);
                                                  }
                                                  else {
                                                    *__position._M_current = local_1a8;
                                                    pppXVar6 = &(this->m_visualizedSpaces).
                                                                                                                                
                                                  super__Vector_base<XrSpace_T_*,_std::allocator<XrSpace_T_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  *pppXVar6 = *pppXVar6 + 1;
                                                  }
                                                  }
                                                  lVar14 = lVar14 + 0x20;
                                                  } while (lVar14 != 0xe0);
                                                  lVar14 = -0xe0;
                                                  do {
                                                    if (plVar15 != (long *)plVar15[-2]) {
                                                      operator_delete((long *)plVar15[-2],
                                                                      *plVar15 + 1);
                                                    }
                                                    plVar15 = plVar15 + -4;
                                                    lVar14 = lVar14 + 0x20;
                                                  } while (lVar14 != 0);
                                                  GetXrReferenceSpaceCreateInfo
                                                            ((XrReferenceSpaceCreateInfo *)local_198
                                                             ,&((this->m_options).
                                                                                                                                
                                                  super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->AppSpace);
                                                  XVar11 = xrCreateReferenceSpace
                                                                     (this->m_session,
                                                                      (XrReferenceSpaceCreateInfo *)
                                                                      local_198,&this->m_appSpace);
                                                  if (XR_ERROR_VALIDATION_FAILURE < XVar11) {
                                                    return;
                                                  }
                                                  originator = 
                                                  "xrCreateReferenceSpace(m_session, &referenceSpaceCreateInfo, &m_appSpace)"
                                                  ;
                                                  pcVar13 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:571"
                                                  ;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ThrowXrResult(XVar11,originator,pcVar13);
}

Assistant:

void InitializeSession() override {
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_session == XR_NULL_HANDLE);

        {
            Log::Write(Log::Level::Verbose, Fmt("Creating session..."));

            XrSessionCreateInfo createInfo{XR_TYPE_SESSION_CREATE_INFO};
            createInfo.next = m_graphicsPlugin->GetGraphicsBinding();
            createInfo.systemId = m_systemId;
            CHECK_XRCMD(xrCreateSession(m_instance, &createInfo, &m_session));
        }

        LogReferenceSpaces();
        InitializeActions();
        CreateVisualizedSpaces();

        {
            XrReferenceSpaceCreateInfo referenceSpaceCreateInfo = GetXrReferenceSpaceCreateInfo(m_options->AppSpace);
            CHECK_XRCMD(xrCreateReferenceSpace(m_session, &referenceSpaceCreateInfo, &m_appSpace));
        }
    }